

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cc
# Opt level: O3

vector<Tle,_std::allocator<Tle>_> * __thiscall
DBSQLite::fetchTLEs(vector<Tle,_std::allocator<Tle>_> *__return_storage_ptr__,DBSQLite *this)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  
  (__return_storage_ptr__->super__Vector_base<Tle,_std::allocator<Tle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tle,_std::allocator<Tle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tle,_std::allocator<Tle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = sqlite3_exec(this->_sql,"SELECT name, line1, line2 FROM tle;",
                       fetchTLEs::anon_class_1_0_00000001::__invoke,__return_storage_ptr__,0);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[-] Error querying database: ",0x1d);
    __s = (char *)sqlite3_errmsg(this->_sql);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x11c3f8);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tle> DBSQLite::fetchTLEs() {
  std::vector<Tle> tles;
  const char *q = "SELECT name, line1, line2 FROM tle;";
  auto cb = [](void *tleptr, int nCols, char **row, char **colName) {
    auto tles = static_cast<std::vector<Tle> *>(tleptr);
    if (nCols != 3)
      return SQLITE_OK;
    std::string name(row[0]);
    std::string line1(row[1]);
    std::string line2(row[2]);
    if (name.size())
      tles->emplace_back(name, line1, line2);
    else
      tles->emplace_back(name, line1, line2);
    return SQLITE_OK;
  };

  if (sqlite3_exec(_sql, q, cb, &tles, nullptr)) {
    std::cerr << "[-] Error querying database: " << sqlite3_errmsg(_sql)
              << std::endl;
    return tles;
  }

  return tles;
}